

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

void applyCoeffs(gdImagePtr src,gdImagePtr dst,double *coeffs,int radius,gdAxis axis)

{
  int local_34;
  int local_30;
  int linelen;
  int numlines;
  int line;
  gdAxis axis_local;
  int radius_local;
  double *coeffs_local;
  gdImagePtr dst_local;
  gdImagePtr src_local;
  
  if (axis == HORIZONTAL) {
    local_30 = src->sy;
    local_34 = src->sx;
  }
  else {
    local_30 = src->sx;
    local_34 = src->sy;
  }
  for (linelen = 0; linelen < local_30; linelen = linelen + 1) {
    applyCoeffsLine(src,dst,linelen,local_34,coeffs,radius,axis);
  }
  return;
}

Assistant:

static void
applyCoeffs(gdImagePtr src, gdImagePtr dst, double *coeffs, int radius, 
            gdAxis axis)
{
    int line, numlines, linelen;

    if (axis == HORIZONTAL) {
        numlines = src->sy;
        linelen = src->sx;
    } else {
        numlines = src->sx;
        linelen = src->sy;
    }/* if .. else*/

    for (line = 0; line < numlines; line++) {
        applyCoeffsLine(src, dst, line, linelen, coeffs, radius, axis);
    }/* for */
}